

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O0

void __thiscall
NavierStokesBase::mac_project
          (NavierStokesBase *this,Real time,Real dt,MultiFab *S_old,MultiFab *divu,int ngrow,
          bool increment_vel_register)

{
  int iVar1;
  BCRec *x;
  Print *this_00;
  NavierStokesBase *in_RDI;
  byte in_R8B;
  uint uVar2;
  Print *in_XMM0_Qa;
  int IOProc;
  Real run_time;
  Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> density_math_bc;
  Real strt_time;
  undefined1 in_stack_00000443;
  int in_stack_00000444;
  MultiFab *in_stack_00000448;
  Real in_stack_00000450;
  Real in_stack_00000458;
  MultiFab *in_stack_00000460;
  MultiFab *in_stack_00000468;
  int in_stack_00000474;
  MacProj *in_stack_00000478;
  BCRec *in_stack_00000490;
  MultiFab *in_stack_000008a0;
  int in_stack_000008ac;
  NavierStokesBase *in_stack_000008b0;
  char (*in_stack_fffffffffffffbd8) [20];
  undefined4 in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe4;
  ostream *in_stack_fffffffffffffc08;
  Print *in_stack_fffffffffffffc10;
  Print *in_stack_fffffffffffffc50;
  int in_stack_fffffffffffffc64;
  undefined1 *in_stack_fffffffffffffc68;
  double local_1f0 [4];
  double local_1d0;
  undefined1 local_1b8 [395];
  byte local_2d;
  Print *local_10;
  
  local_2d = in_R8B & 1;
  local_10 = in_XMM0_Qa;
  if (verbose != 0) {
    amrex::OutStream();
    in_stack_fffffffffffffc68 = local_1b8;
    amrex::Print::Print(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    amrex::Print::operator<<
              ((Print *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbd8);
    amrex::Print::~Print(in_stack_fffffffffffffc50);
  }
  if ((verbose != 0) && (((anonymous_namespace)::benchmarking & 1) != 0)) {
    amrex::ParallelDescriptor::Barrier((string *)amrex::ParallelDescriptor::Unnamed_abi_cxx11_);
  }
  local_1d0 = amrex::ParallelDescriptor::second();
  fetchBCArray(in_RDI,(int)((ulong)in_stack_fffffffffffffc68 >> 0x20),(int)in_stack_fffffffffffffc68
               ,in_stack_fffffffffffffc64);
  x = amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::operator[]
                ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)
                 CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
                 (size_type)in_stack_fffffffffffffbd8);
  uVar2 = local_2d & 1;
  MacProj::mac_project
            (in_stack_00000478,in_stack_00000474,in_stack_00000468,in_stack_00000460,
             in_stack_00000458,in_stack_00000450,in_stack_00000448,in_stack_00000444,
             in_stack_00000490,(bool)in_stack_00000443);
  create_umac_grown(in_stack_000008b0,in_stack_000008ac,in_stack_000008a0);
  if (verbose != 0) {
    local_1f0[0] = amrex::ParallelDescriptor::second();
    local_1f0[0] = local_1f0[0] - local_1d0;
    iVar1 = amrex::ParallelDescriptor::IOProcessorNumber();
    amrex::ParallelDescriptor::ReduceRealMax<double>(local_1f0,iVar1);
    this_00 = (Print *)amrex::OutStream();
    amrex::Print::Print(this_00,in_stack_fffffffffffffc08);
    amrex::Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffbe4,uVar2),(char (*) [38])x);
    amrex::Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffbe4,uVar2),x->bc);
    amrex::Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffbe4,uVar2),(char (*) [9])x);
    amrex::Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffbe4,uVar2),(double *)x);
    amrex::Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffffbe4,uVar2),(char *)x);
    amrex::Print::~Print(local_10);
  }
  amrex::Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::~Vector
            ((Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x52384d);
  return;
}

Assistant:

void
NavierStokesBase::mac_project (Real      time,
                               Real      dt,
                               MultiFab& S_old,
                               MultiFab* divu,
                               int       ngrow,
                               bool      increment_vel_register)
{
    BL_PROFILE_REGION_START("R::NavierStokesBase::mac_project()");
    BL_PROFILE("NavierStokesBase::mac_project()");

    if (verbose) {
        amrex::Print() << "... mac_projection\n";
    }

    if (verbose && benchmarking) {
        ParallelDescriptor::Barrier();
    }

    const Real strt_time = ParallelDescriptor::second();

    Vector<BCRec> density_math_bc = fetchBCArray(State_Type,Density,1);

    mac_projector->mac_project(level,u_mac,S_old,dt,time,*divu,have_divu,
                               density_math_bc[0], increment_vel_register);

    create_umac_grown(ngrow, divu);

    if (verbose)
    {
        Real run_time    = ParallelDescriptor::second() - strt_time;
        const int IOProc = ParallelDescriptor::IOProcessorNumber();

        ParallelDescriptor::ReduceRealMax(run_time,IOProc);

        amrex::Print() << "NavierStokesBase:mac_project(): lev: "
                       << level
                       << ", time: " << run_time << '\n';
    }
    BL_PROFILE_REGION_STOP("R::NavierStokesBase::mac_project()");
}